

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::UserGeometry> *recalculatePrimRef)

{
  float fVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  PrimRefMB *pPVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [64];
  float fVar47;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar49;
  undefined1 in_register_000014c4 [12];
  ulong local_140;
  PrimRefMB *local_138;
  size_t local_130;
  TemporalBinInfo *local_128;
  RecalculatePrimRef<embree::UserGeometry> *local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_16_2_4e716a3c local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  auVar22._8_56_ = in_register_00001208;
  auVar22._0_8_ = time_range;
  local_a8 = auVar22._0_16_;
  local_b8 = vmovshdup_avx(local_a8);
  auVar41 = ZEXT1664(local_b8);
  fVar1 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar24 = (set->super_PrimInfoMB).max_time_range.upper - fVar1;
  fVar33 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar29 = (((time_range.lower * 0.5 + local_b8._0_4_ * 0.5) - fVar1) / fVar24) * fVar33;
  auVar19._8_4_ = 0x80000000;
  auVar19._0_8_ = 0x8000000080000000;
  auVar19._12_4_ = 0x80000000;
  auVar19 = vandps_avx(ZEXT416((uint)fVar29),auVar19);
  auVar25._8_4_ = 0x3effffff;
  auVar25._0_8_ = 0x3effffff3effffff;
  auVar25._12_4_ = 0x3effffff;
  auVar19 = vorps_avx(auVar19,auVar25);
  auVar19 = ZEXT416((uint)(fVar29 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  fVar1 = (auVar19._0_4_ / fVar33) * fVar24 + fVar1;
  if ((time_range.lower < fVar1) && (fVar1 < local_b8._0_4_)) {
    local_138 = prims;
    local_130 = end;
    local_128 = this;
    local_120 = recalculatePrimRef;
    for (; begin < end; begin = begin + 1) {
      fVar29 = prims[begin].time_range.upper * 0.9999;
      pPVar12 = prims;
      if ((auVar22._0_4_ < fVar29) && (prims[begin].time_range.lower * 1.0001 < fVar1)) {
        local_140 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        local_d8.this =
             (AccelSet *)
             (local_120->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_d8.primID = &local_140;
        fVar29 = ((local_d8.this)->super_Geometry).fnumTimeSegments;
        fVar24 = ((local_d8.this)->super_Geometry).time_range.lower;
        fVar17 = ((local_d8.this)->super_Geometry).time_range.upper - fVar24;
        fVar23 = (auVar22._0_4_ - fVar24) / fVar17;
        fVar17 = (fVar1 - fVar24) / fVar17;
        fVar24 = fVar29 * fVar23;
        fVar33 = fVar29 * fVar17;
        auVar30 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
        auVar34 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
        auVar19 = vmaxss_avx(auVar30,ZEXT816(0));
        auVar25 = vminss_avx(auVar34,ZEXT416((uint)fVar29));
        iVar14 = (int)auVar19._0_4_;
        fVar28 = auVar25._0_4_;
        iVar15 = (int)auVar30._0_4_;
        iVar13 = -1;
        if (-1 < iVar15) {
          iVar13 = iVar15;
        }
        iVar8 = (int)fVar29 + 1;
        if ((int)auVar34._0_4_ < (int)fVar29 + 1) {
          iVar8 = (int)auVar34._0_4_;
        }
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower0,&local_d8,(long)iVar14);
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper1,&local_d8,(long)(int)fVar28);
        fVar24 = fVar24 - auVar19._0_4_;
        if (iVar8 - iVar13 == 1) {
          auVar19 = ZEXT816(0) << 0x40;
          auVar25 = vmaxss_avx(ZEXT416((uint)fVar24),auVar19);
          auVar30 = vshufps_avx(auVar25,auVar25,0);
          auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar39._0_4_ =
               auVar30._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar25._0_4_ * blower0.lower.field_0.m128[0];
          auVar39._4_4_ =
               auVar30._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar25._4_4_ * blower0.lower.field_0.m128[1];
          auVar39._8_4_ =
               auVar30._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar25._8_4_ * blower0.lower.field_0.m128[2];
          auVar39._12_4_ =
               auVar30._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar25._12_4_ * blower0.lower.field_0.m128[3];
          auVar45._0_4_ =
               auVar30._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar25._0_4_ * blower0.upper.field_0.m128[0];
          auVar45._4_4_ =
               auVar30._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar25._4_4_ * blower0.upper.field_0.m128[1];
          auVar45._8_4_ =
               auVar30._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar25._8_4_ * blower0.upper.field_0.m128[2];
          auVar45._12_4_ =
               auVar30._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar25._12_4_ * blower0.upper.field_0.m128[3];
          auVar25 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar33)),auVar19);
          auVar7 = vshufps_avx(auVar25,auVar25,0);
          auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar30._0_4_ =
               auVar25._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar7._0_4_ * blower0.lower.field_0.m128[0];
          auVar30._4_4_ =
               auVar25._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar7._4_4_ * blower0.lower.field_0.m128[1];
          auVar30._8_4_ =
               auVar25._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar7._8_4_ * blower0.lower.field_0.m128[2];
          auVar30._12_4_ =
               auVar25._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar7._12_4_ * blower0.lower.field_0.m128[3];
          auVar34._0_4_ =
               auVar25._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar7._0_4_ * blower0.upper.field_0.m128[0];
          auVar34._4_4_ =
               auVar25._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar7._4_4_ * blower0.upper.field_0.m128[1];
          auVar34._8_4_ =
               auVar25._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar7._8_4_ * blower0.upper.field_0.m128[2];
          auVar34._12_4_ =
               auVar25._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar7._12_4_ * blower0.upper.field_0.m128[3];
        }
        else {
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower1,&local_d8,(long)(iVar14 + 1));
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper0,&local_d8,(long)((int)fVar28 + -1));
          auVar19 = vmaxss_avx(ZEXT416((uint)fVar24),ZEXT816(0) << 0x40);
          auVar25 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar39._0_4_ =
               auVar25._0_4_ * blower1.lower.field_0.m128[0] +
               auVar19._0_4_ * blower0.lower.field_0.m128[0];
          auVar39._4_4_ =
               auVar25._4_4_ * blower1.lower.field_0.m128[1] +
               auVar19._4_4_ * blower0.lower.field_0.m128[1];
          auVar39._8_4_ =
               auVar25._8_4_ * blower1.lower.field_0.m128[2] +
               auVar19._8_4_ * blower0.lower.field_0.m128[2];
          auVar39._12_4_ =
               auVar25._12_4_ * blower1.lower.field_0.m128[3] +
               auVar19._12_4_ * blower0.lower.field_0.m128[3];
          auVar45._0_4_ =
               auVar25._0_4_ * blower1.upper.field_0.m128[0] +
               auVar19._0_4_ * blower0.upper.field_0.m128[0];
          auVar45._4_4_ =
               auVar25._4_4_ * blower1.upper.field_0.m128[1] +
               auVar19._4_4_ * blower0.upper.field_0.m128[1];
          auVar45._8_4_ =
               auVar25._8_4_ * blower1.upper.field_0.m128[2] +
               auVar19._8_4_ * blower0.upper.field_0.m128[2];
          auVar45._12_4_ =
               auVar25._12_4_ * blower1.upper.field_0.m128[3] +
               auVar19._12_4_ * blower0.upper.field_0.m128[3];
          auVar19 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar33)),ZEXT816(0) << 0x40);
          auVar25 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar30._0_4_ =
               auVar25._0_4_ * bupper0.lower.field_0.m128[0] +
               auVar19._0_4_ * bupper1.lower.field_0.m128[0];
          auVar30._4_4_ =
               auVar25._4_4_ * bupper0.lower.field_0.m128[1] +
               auVar19._4_4_ * bupper1.lower.field_0.m128[1];
          auVar30._8_4_ =
               auVar25._8_4_ * bupper0.lower.field_0.m128[2] +
               auVar19._8_4_ * bupper1.lower.field_0.m128[2];
          auVar30._12_4_ =
               auVar25._12_4_ * bupper0.lower.field_0.m128[3] +
               auVar19._12_4_ * bupper1.lower.field_0.m128[3];
          auVar34._0_4_ =
               auVar25._0_4_ * bupper0.upper.field_0.m128[0] +
               auVar19._0_4_ * bupper1.upper.field_0.m128[0];
          auVar34._4_4_ =
               auVar25._4_4_ * bupper0.upper.field_0.m128[1] +
               auVar19._4_4_ * bupper1.upper.field_0.m128[1];
          auVar34._8_4_ =
               auVar25._8_4_ * bupper0.upper.field_0.m128[2] +
               auVar19._8_4_ * bupper1.upper.field_0.m128[2];
          auVar34._12_4_ =
               auVar25._12_4_ * bupper0.upper.field_0.m128[3] +
               auVar19._12_4_ * bupper1.upper.field_0.m128[3];
          if (iVar15 < 0) {
            iVar15 = -1;
          }
          sVar16 = (size_t)iVar15;
          while (sVar16 = sVar16 + 1, (long)sVar16 < (long)iVar8) {
            auVar18._0_4_ = ((float)(int)sVar16 / fVar29 - fVar23) / (fVar17 - fVar23);
            auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar19 = vshufps_avx(auVar18,auVar18,0);
            fVar24 = auVar30._4_4_;
            fVar33 = auVar30._8_4_;
            fVar28 = auVar30._12_4_;
            auVar25 = vshufps_avx(ZEXT416((uint)(1.0 - auVar18._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar18._0_4_)),0);
            fVar42 = auVar39._4_4_;
            fVar43 = auVar39._8_4_;
            fVar44 = auVar39._12_4_;
            fVar36 = auVar34._4_4_;
            fVar37 = auVar34._8_4_;
            fVar38 = auVar34._12_4_;
            fVar47 = auVar45._4_4_;
            fVar48 = auVar45._8_4_;
            fVar49 = auVar45._12_4_;
            local_c8 = auVar34._0_4_ * auVar19._0_4_ + auVar45._0_4_ * auVar25._0_4_;
            fStack_c4 = fVar36 * auVar19._4_4_ + fVar47 * auVar25._4_4_;
            fStack_c0 = fVar37 * auVar19._8_4_ + fVar48 * auVar25._8_4_;
            fStack_bc = fVar38 * auVar19._12_4_ + fVar49 * auVar25._12_4_;
            AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_d8,sVar16);
            auVar7._4_4_ = fVar24 * auVar19._4_4_ + fVar42 * auVar25._4_4_;
            auVar7._0_4_ = auVar30._0_4_ * auVar19._0_4_ + auVar39._0_4_ * auVar25._0_4_;
            auVar7._8_4_ = fVar33 * auVar19._8_4_ + fVar43 * auVar25._8_4_;
            auVar7._12_4_ = fVar28 * auVar19._12_4_ + fVar44 * auVar25._12_4_;
            auVar19 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar7);
            auVar10._4_4_ = fStack_c4;
            auVar10._0_4_ = local_c8;
            auVar10._8_4_ = fStack_c0;
            auVar10._12_4_ = fStack_bc;
            auVar7 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
            auVar25 = vminps_avx(auVar19,ZEXT816(0) << 0x40);
            auVar19 = vmaxps_avx(auVar7,ZEXT816(0) << 0x40);
            auVar39._0_4_ = auVar39._0_4_ + auVar25._0_4_;
            auVar39._4_4_ = fVar42 + auVar25._4_4_;
            auVar39._8_4_ = fVar43 + auVar25._8_4_;
            auVar39._12_4_ = fVar44 + auVar25._12_4_;
            auVar30._0_4_ = auVar30._0_4_ + auVar25._0_4_;
            auVar30._4_4_ = fVar24 + auVar25._4_4_;
            auVar30._8_4_ = fVar33 + auVar25._8_4_;
            auVar30._12_4_ = fVar28 + auVar25._12_4_;
            auVar45._0_4_ = auVar45._0_4_ + auVar19._0_4_;
            auVar45._4_4_ = fVar47 + auVar19._4_4_;
            auVar45._8_4_ = fVar48 + auVar19._8_4_;
            auVar45._12_4_ = fVar49 + auVar19._12_4_;
            auVar34._0_4_ = auVar34._0_4_ + auVar19._0_4_;
            auVar34._4_4_ = fVar36 + auVar19._4_4_;
            auVar34._8_4_ = fVar37 + auVar19._8_4_;
            auVar34._12_4_ = fVar38 + auVar19._12_4_;
          }
          auVar19 = ZEXT816(0) << 0x40;
        }
        aVar5.m128 = (__m128)vminps_avx(local_128->bounds0[0].bounds0.lower.field_0,auVar39);
        aVar3.m128 = (__m128)vmaxps_avx(local_128->bounds0[0].bounds0.upper.field_0,auVar45);
        aVar6.m128 = (__m128)vminps_avx(local_128->bounds0[0].bounds1.lower.field_0,auVar30);
        aVar4.m128 = (__m128)vmaxps_avx(local_128->bounds0[0].bounds1.upper.field_0,auVar34);
        local_128->bounds0[0].bounds0.lower.field_0 = aVar5;
        local_128->bounds0[0].bounds0.upper.field_0 = aVar3;
        local_128->bounds0[0].bounds1.lower.field_0 = aVar6;
        local_128->bounds0[0].bounds1.upper.field_0 = aVar4;
        auVar31._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar31._4_12_ = in_register_000014c4;
        BVar2 = prims[begin].time_range;
        auVar26._8_8_ = 0;
        auVar26._0_4_ = BVar2.lower;
        auVar26._4_4_ = BVar2.upper;
        auVar25 = vmovshdup_avx(auVar26);
        fVar24 = BVar2.lower;
        fVar29 = auVar25._0_4_ - fVar24;
        auVar22 = ZEXT1664(local_a8);
        auVar25 = ZEXT416((uint)(((local_a8._0_4_ - fVar24) / fVar29) * 1.0000002 * auVar31._0_4_));
        auVar25 = vroundss_avx(auVar25,auVar25,9);
        auVar19 = vmaxss_avx(auVar19,auVar25);
        auVar25 = ZEXT416((uint)(((fVar1 - fVar24) / fVar29) * 0.99999976 * auVar31._0_4_));
        auVar25 = vroundss_avx(auVar25,auVar25,10);
        auVar25 = vminss_avx(auVar25,auVar31);
        local_128->count0[0] =
             local_128->count0[0] + (long)((int)auVar25._0_4_ - (int)auVar19._0_4_);
        fVar29 = prims[begin].time_range.upper * 0.9999;
        auVar41 = ZEXT1664(local_b8);
        end = local_130;
        pPVar12 = local_138;
      }
      if ((fVar1 < fVar29) && (prims[begin].time_range.lower * 1.0001 < auVar41._0_4_)) {
        local_140 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        local_d8.this =
             (AccelSet *)
             (local_120->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_d8.primID = &local_140;
        fVar29 = ((local_d8.this)->super_Geometry).fnumTimeSegments;
        fVar24 = ((local_d8.this)->super_Geometry).time_range.lower;
        fVar17 = ((local_d8.this)->super_Geometry).time_range.upper - fVar24;
        fVar23 = (fVar1 - fVar24) / fVar17;
        fVar17 = (auVar41._0_4_ - fVar24) / fVar17;
        fVar24 = fVar29 * fVar23;
        fVar33 = fVar29 * fVar17;
        auVar30 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
        auVar34 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
        auVar19 = vmaxss_avx(auVar30,ZEXT816(0));
        auVar25 = vminss_avx(auVar34,ZEXT416((uint)fVar29));
        iVar14 = (int)auVar19._0_4_;
        fVar28 = auVar25._0_4_;
        iVar15 = (int)auVar30._0_4_;
        iVar13 = -1;
        if (-1 < iVar15) {
          iVar13 = iVar15;
        }
        iVar8 = (int)fVar29 + 1;
        if ((int)auVar34._0_4_ < (int)fVar29 + 1) {
          iVar8 = (int)auVar34._0_4_;
        }
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower0,&local_d8,(long)iVar14);
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper1,&local_d8,(long)(int)fVar28);
        fVar24 = fVar24 - auVar19._0_4_;
        if (iVar8 - iVar13 == 1) {
          auVar19 = ZEXT816(0) << 0x40;
          auVar25 = vmaxss_avx(ZEXT416((uint)fVar24),auVar19);
          auVar30 = vshufps_avx(auVar25,auVar25,0);
          auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar40._0_4_ =
               auVar30._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar25._0_4_ * blower0.lower.field_0.m128[0];
          auVar40._4_4_ =
               auVar30._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar25._4_4_ * blower0.lower.field_0.m128[1];
          auVar40._8_4_ =
               auVar30._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar25._8_4_ * blower0.lower.field_0.m128[2];
          auVar40._12_4_ =
               auVar30._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar25._12_4_ * blower0.lower.field_0.m128[3];
          auVar46._0_4_ =
               auVar30._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar25._0_4_ * blower0.upper.field_0.m128[0];
          auVar46._4_4_ =
               auVar30._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar25._4_4_ * blower0.upper.field_0.m128[1];
          auVar46._8_4_ =
               auVar30._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar25._8_4_ * blower0.upper.field_0.m128[2];
          auVar46._12_4_ =
               auVar30._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar25._12_4_ * blower0.upper.field_0.m128[3];
          auVar25 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar33)),auVar19);
          auVar30 = vshufps_avx(auVar25,auVar25,0);
          auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar32._0_4_ =
               auVar25._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar30._0_4_ * blower0.lower.field_0.m128[0];
          auVar32._4_4_ =
               auVar25._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar30._4_4_ * blower0.lower.field_0.m128[1];
          auVar32._8_4_ =
               auVar25._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar30._8_4_ * blower0.lower.field_0.m128[2];
          auVar32._12_4_ =
               auVar25._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar30._12_4_ * blower0.lower.field_0.m128[3];
          auVar35._0_4_ =
               auVar25._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar30._0_4_ * blower0.upper.field_0.m128[0];
          auVar35._4_4_ =
               auVar25._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar30._4_4_ * blower0.upper.field_0.m128[1];
          auVar35._8_4_ =
               auVar25._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar30._8_4_ * blower0.upper.field_0.m128[2];
          auVar35._12_4_ =
               auVar25._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar30._12_4_ * blower0.upper.field_0.m128[3];
        }
        else {
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower1,&local_d8,(long)(iVar14 + 1));
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper0,&local_d8,(long)((int)fVar28 + -1));
          auVar19 = vmaxss_avx(ZEXT416((uint)fVar24),ZEXT816(0) << 0x40);
          auVar25 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar40._0_4_ =
               auVar25._0_4_ * blower1.lower.field_0.m128[0] +
               auVar19._0_4_ * blower0.lower.field_0.m128[0];
          auVar40._4_4_ =
               auVar25._4_4_ * blower1.lower.field_0.m128[1] +
               auVar19._4_4_ * blower0.lower.field_0.m128[1];
          auVar40._8_4_ =
               auVar25._8_4_ * blower1.lower.field_0.m128[2] +
               auVar19._8_4_ * blower0.lower.field_0.m128[2];
          auVar40._12_4_ =
               auVar25._12_4_ * blower1.lower.field_0.m128[3] +
               auVar19._12_4_ * blower0.lower.field_0.m128[3];
          auVar46._0_4_ =
               auVar25._0_4_ * blower1.upper.field_0.m128[0] +
               auVar19._0_4_ * blower0.upper.field_0.m128[0];
          auVar46._4_4_ =
               auVar25._4_4_ * blower1.upper.field_0.m128[1] +
               auVar19._4_4_ * blower0.upper.field_0.m128[1];
          auVar46._8_4_ =
               auVar25._8_4_ * blower1.upper.field_0.m128[2] +
               auVar19._8_4_ * blower0.upper.field_0.m128[2];
          auVar46._12_4_ =
               auVar25._12_4_ * blower1.upper.field_0.m128[3] +
               auVar19._12_4_ * blower0.upper.field_0.m128[3];
          auVar19 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar33)),ZEXT816(0) << 0x40);
          auVar25 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar32._0_4_ =
               auVar25._0_4_ * bupper0.lower.field_0.m128[0] +
               auVar19._0_4_ * bupper1.lower.field_0.m128[0];
          auVar32._4_4_ =
               auVar25._4_4_ * bupper0.lower.field_0.m128[1] +
               auVar19._4_4_ * bupper1.lower.field_0.m128[1];
          auVar32._8_4_ =
               auVar25._8_4_ * bupper0.lower.field_0.m128[2] +
               auVar19._8_4_ * bupper1.lower.field_0.m128[2];
          auVar32._12_4_ =
               auVar25._12_4_ * bupper0.lower.field_0.m128[3] +
               auVar19._12_4_ * bupper1.lower.field_0.m128[3];
          auVar35._0_4_ =
               auVar25._0_4_ * bupper0.upper.field_0.m128[0] +
               auVar19._0_4_ * bupper1.upper.field_0.m128[0];
          auVar35._4_4_ =
               auVar25._4_4_ * bupper0.upper.field_0.m128[1] +
               auVar19._4_4_ * bupper1.upper.field_0.m128[1];
          auVar35._8_4_ =
               auVar25._8_4_ * bupper0.upper.field_0.m128[2] +
               auVar19._8_4_ * bupper1.upper.field_0.m128[2];
          auVar35._12_4_ =
               auVar25._12_4_ * bupper0.upper.field_0.m128[3] +
               auVar19._12_4_ * bupper1.upper.field_0.m128[3];
          if (iVar15 < 0) {
            iVar15 = -1;
          }
          sVar16 = (size_t)iVar15;
          while (sVar16 = sVar16 + 1, (long)sVar16 < (long)iVar8) {
            auVar20._0_4_ = ((float)(int)sVar16 / fVar29 - fVar23) / (fVar17 - fVar23);
            auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar19 = vshufps_avx(auVar20,auVar20,0);
            fVar24 = auVar32._4_4_;
            fVar33 = auVar32._8_4_;
            fVar28 = auVar32._12_4_;
            auVar25 = vshufps_avx(ZEXT416((uint)(1.0 - auVar20._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar20._0_4_)),0);
            fVar42 = auVar40._4_4_;
            fVar43 = auVar40._8_4_;
            fVar44 = auVar40._12_4_;
            fVar36 = auVar35._4_4_;
            fVar37 = auVar35._8_4_;
            fVar38 = auVar35._12_4_;
            fVar47 = auVar46._4_4_;
            fVar48 = auVar46._8_4_;
            fVar49 = auVar46._12_4_;
            local_c8 = auVar35._0_4_ * auVar19._0_4_ + auVar46._0_4_ * auVar25._0_4_;
            fStack_c4 = fVar36 * auVar19._4_4_ + fVar47 * auVar25._4_4_;
            fStack_c0 = fVar37 * auVar19._8_4_ + fVar48 * auVar25._8_4_;
            fStack_bc = fVar38 * auVar19._12_4_ + fVar49 * auVar25._12_4_;
            AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_d8,sVar16);
            auVar9._4_4_ = fVar24 * auVar19._4_4_ + fVar42 * auVar25._4_4_;
            auVar9._0_4_ = auVar32._0_4_ * auVar19._0_4_ + auVar40._0_4_ * auVar25._0_4_;
            auVar9._8_4_ = fVar33 * auVar19._8_4_ + fVar43 * auVar25._8_4_;
            auVar9._12_4_ = fVar28 * auVar19._12_4_ + fVar44 * auVar25._12_4_;
            auVar19 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar9);
            auVar11._4_4_ = fStack_c4;
            auVar11._0_4_ = local_c8;
            auVar11._8_4_ = fStack_c0;
            auVar11._12_4_ = fStack_bc;
            auVar30 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar11);
            auVar25 = vminps_avx(auVar19,ZEXT816(0) << 0x40);
            auVar19 = vmaxps_avx(auVar30,ZEXT816(0) << 0x40);
            auVar40._0_4_ = auVar40._0_4_ + auVar25._0_4_;
            auVar40._4_4_ = fVar42 + auVar25._4_4_;
            auVar40._8_4_ = fVar43 + auVar25._8_4_;
            auVar40._12_4_ = fVar44 + auVar25._12_4_;
            auVar32._0_4_ = auVar32._0_4_ + auVar25._0_4_;
            auVar32._4_4_ = fVar24 + auVar25._4_4_;
            auVar32._8_4_ = fVar33 + auVar25._8_4_;
            auVar32._12_4_ = fVar28 + auVar25._12_4_;
            auVar46._0_4_ = auVar46._0_4_ + auVar19._0_4_;
            auVar46._4_4_ = fVar47 + auVar19._4_4_;
            auVar46._8_4_ = fVar48 + auVar19._8_4_;
            auVar46._12_4_ = fVar49 + auVar19._12_4_;
            auVar35._0_4_ = auVar35._0_4_ + auVar19._0_4_;
            auVar35._4_4_ = fVar36 + auVar19._4_4_;
            auVar35._8_4_ = fVar37 + auVar19._8_4_;
            auVar35._12_4_ = fVar38 + auVar19._12_4_;
          }
          auVar19 = ZEXT816(0) << 0x40;
        }
        aVar5.m128 = (__m128)vminps_avx(local_128->bounds1[0].bounds0.lower.field_0,auVar40);
        aVar3.m128 = (__m128)vmaxps_avx(local_128->bounds1[0].bounds0.upper.field_0,auVar46);
        aVar6.m128 = (__m128)vminps_avx(local_128->bounds1[0].bounds1.lower.field_0,auVar32);
        aVar4.m128 = (__m128)vmaxps_avx(local_128->bounds1[0].bounds1.upper.field_0,auVar35);
        local_128->bounds1[0].bounds0.lower.field_0 = aVar5;
        local_128->bounds1[0].bounds0.upper.field_0 = aVar3;
        local_128->bounds1[0].bounds1.lower.field_0 = aVar6;
        local_128->bounds1[0].bounds1.upper.field_0 = aVar4;
        auVar21._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar21._4_12_ = in_register_000014c4;
        BVar2 = prims[begin].time_range;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = BVar2.lower;
        auVar27._4_4_ = BVar2.upper;
        fVar24 = BVar2.lower;
        auVar25 = vmovshdup_avx(auVar27);
        fVar29 = auVar25._0_4_ - fVar24;
        auVar41 = ZEXT1664(local_b8);
        auVar25 = ZEXT416((uint)(((fVar1 - fVar24) / fVar29) * 1.0000002 * auVar21._0_4_));
        auVar25 = vroundss_avx(auVar25,auVar25,9);
        auVar19 = vmaxss_avx(auVar19,auVar25);
        auVar25 = ZEXT416((uint)(((local_b8._0_4_ - fVar24) / fVar29) * 0.99999976 * auVar21._0_4_))
        ;
        auVar25 = vroundss_avx(auVar25,auVar25,10);
        auVar25 = vminss_avx(auVar25,auVar21);
        local_128->count1[0] =
             local_128->count1[0] + (long)((int)auVar25._0_4_ - (int)auVar19._0_4_);
        auVar22 = ZEXT1664(local_a8);
        end = local_130;
        pPVar12 = local_138;
      }
      prims = pPVar12;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }